

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall Server::Server(Server *this,IPAddress *addr,uint16_t port)

{
  int iVar1;
  impl_ *piVar2;
  
  this->_vptr_Server = (_func_int **)&PTR_ClientFactory_001d3bd0;
  piVar2 = (impl_ *)operator_new(0x188);
  iVar1 = socket(2,1,0);
  piVar2->sock = iVar1;
  this->impl = piVar2;
  (this->address).address = 0;
  this->state = Created;
  this->recv_buffer_max = 0x8000;
  this->send_buffer_max = 0x8000;
  this->maxconn = 0;
  (this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->clients;
  (this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->clients;
  (this->clients).super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node._M_size = 0;
  Bind(this,addr,port);
  return;
}

Assistant:

Server::Server(const IPAddress &addr, uint16_t port)
	: impl(new impl_(socket(AF_INET, SOCK_STREAM, 0)))
	, state(Created)
	, recv_buffer_max(32 * 1024)
	, send_buffer_max(32 * 1024)
	, maxconn(0)
{
	this->Bind(addr, port);
}